

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

void __thiscall chrono::ChFrameMoving<double>::Invert(ChFrameMoving<double> *this)

{
  ChFrameMoving<double> unit;
  ChFrameMoving<double> tmp;
  ChQuaternion<double> local_248;
  ChVector<double> local_228;
  ChFrameMoving<double> local_210;
  ChFrameMoving<double> local_118;
  
  local_248.m_data[2] = 0.0;
  local_210.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_210.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_248.m_data[0] = 0.0;
  local_248.m_data[1] = 0.0;
  local_210.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_210.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  ChFrameMoving(&local_118,(ChVector<double> *)&local_248,(ChQuaternion<double> *)&local_210);
  local_248.m_data[0] = 1.0;
  local_248.m_data[3] = 0.0;
  local_228.m_data[2] = 0.0;
  local_248.m_data[1] = 0.0;
  local_248.m_data[2] = 0.0;
  local_228.m_data[0] = 0.0;
  local_228.m_data[1] = 0.0;
  ChFrameMoving(&local_210,&local_228,&local_248);
  operator=(&local_118,this);
  TransformParentToLocal(&local_118,&local_210,this);
  return;
}

Assistant:

virtual void Invert() override {
        ChFrameMoving<Real> tmp;
        ChFrameMoving<Real> unit;
        tmp = *this;
        tmp.TransformParentToLocal(unit, *this);
    }